

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O2

void __thiscall CPartialMerkleTreeTester::Damage(CPartialMerkleTreeTester *this)

{
  byte *pbVar1;
  long lVar2;
  unsigned_long uVar3;
  uint64_t uVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                    (&this->m_rng->super_RandomMixin<FastRandomContext>,
                     (long)(this->super_CPartialMerkleTree).vHash.
                           super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->super_CPartialMerkleTree).vHash.
                           super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Vector_impl_data._M_start >> 5);
  uVar4 = RandomMixin<FastRandomContext>::randbits
                    (&this->m_rng->super_RandomMixin<FastRandomContext>,8);
  pbVar1 = (byte *)((long)(this->super_CPartialMerkleTree).vHash.
                          super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3 & 0xffffffff].super_base_blob<256U>
                          .m_data._M_elems + (long)((int)uVar4 >> 3));
  *pbVar1 = *pbVar1 ^ (byte)(1 << ((byte)uVar4 & 7));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Damage() {
        unsigned int n = m_rng.randrange(vHash.size());
        int bit = m_rng.randbits(8);
        *(vHash[n].begin() + (bit>>3)) ^= 1<<(bit&7);
    }